

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_unitsNotEqualImportedUnits_Test::Equality_unitsNotEqualImportedUnits_Test
          (Equality_unitsNotEqualImportedUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012eb60;
  return;
}

Assistant:

TEST(Equality, unitsNotEqualImportedUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("name");
    libcellml::UnitsPtr u2 = libcellml::Units::create("name");

    libcellml::ImportSourcePtr iS = libcellml::ImportSource::create();

    u1->setImportSource(iS);

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}